

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexes.cpp
# Opt level: O3

uint256 * jbcoin::getQualityIndex(uint256 *__return_storage_ptr__,uint256 *uBase,uint64_t uNodeDir)

{
  undefined8 uVar1;
  
  *(undefined8 *)(__return_storage_ptr__->pn + 4) = *(undefined8 *)(uBase->pn + 4);
  uVar1 = *(undefined8 *)(uBase->pn + 2);
  *(undefined8 *)__return_storage_ptr__->pn = *(undefined8 *)uBase->pn;
  *(undefined8 *)(__return_storage_ptr__->pn + 2) = uVar1;
  *(uint64_t *)(__return_storage_ptr__->pn + 6) =
       uNodeDir >> 0x38 | (uNodeDir & 0xff000000000000) >> 0x28 |
       (uNodeDir & 0xff0000000000) >> 0x18 | (uNodeDir & 0xff00000000) >> 8 |
       (uNodeDir & 0xff000000) << 8 | (uNodeDir & 0xff0000) << 0x18 | (uNodeDir & 0xff00) << 0x28 |
       uNodeDir << 0x38;
  return __return_storage_ptr__;
}

Assistant:

uint256
getQualityIndex (uint256 const& uBase, const std::uint64_t uNodeDir)
{
    // Indexes are stored in big endian format: they print as hex as stored.
    // Most significant bytes are first.  Least significant bytes represent
    // adjacent entries.  We place uNodeDir in the 8 right most bytes to be
    // adjacent.  Want uNodeDir in big endian format so ++ goes to the next
    // entry for indexes.
    uint256 uNode (uBase);

    // TODO(tom): there must be a better way.
    // VFALCO [base_uint] This assumes a certain storage format
    ((std::uint64_t*) uNode.end ())[-1] = htobe64 (uNodeDir);

    return uNode;
}